

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing_sse2.c
# Opt level: O3

int DispatchAlpha_SSE2(uint8_t *alpha,int alpha_stride,int width,int height,uint8_t *dst,
                      int dst_stride)

{
  byte bVar1;
  int iVar2;
  undefined1 auVar3 [15];
  undefined1 auVar4 [14];
  undefined1 auVar5 [15];
  undefined1 auVar6 [14];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [13];
  undefined1 auVar11 [13];
  undefined1 auVar12 [15];
  undefined1 auVar13 [15];
  undefined1 auVar14 [13];
  undefined1 auVar15 [15];
  undefined1 auVar16 [15];
  undefined1 auVar17 [15];
  undefined1 auVar18 [15];
  undefined1 auVar19 [15];
  undefined1 auVar20 [15];
  undefined1 auVar21 [15];
  undefined1 auVar22 [15];
  unkuint9 Var23;
  undefined1 auVar24 [11];
  undefined1 auVar25 [13];
  undefined1 auVar26 [14];
  undefined1 auVar27 [13];
  undefined1 auVar28 [15];
  undefined1 auVar29 [11];
  undefined1 auVar30 [13];
  undefined1 auVar31 [14];
  undefined1 auVar32 [15];
  undefined1 auVar33 [15];
  undefined1 auVar34 [15];
  undefined1 auVar35 [15];
  byte bVar36;
  int iVar37;
  uint uVar38;
  ulong uVar39;
  ulong uVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  ushort uVar45;
  undefined1 uVar50;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  
  auVar42 = _DAT_0018ac20;
  if (height < 1) {
    return 0;
  }
  auVar41._8_4_ = 0xffffffff;
  auVar41._0_8_ = 0xffffffffffffffff;
  auVar41._12_4_ = 0xffffffff;
  iVar37 = 0;
  bVar36 = 0xff;
  auVar43._8_4_ = 0xffffffff;
  auVar43._0_8_ = 0xffffffffffffffff;
  auVar43._12_4_ = 0xffffffff;
  do {
    if (width < 0x11) {
      uVar40 = 0;
    }
    else {
      uVar39 = 0;
      do {
        auVar48 = *(undefined1 (*) [16])(alpha + uVar39);
        auVar41 = auVar41 & auVar48;
        uVar38 = CONCAT13(0,CONCAT12(auVar48[9],(ushort)auVar48[8]));
        auVar3[0xd] = 0;
        auVar3._0_13_ = auVar48._0_13_;
        auVar3[0xe] = auVar48[7];
        auVar7[0xc] = auVar48[6];
        auVar7._0_12_ = auVar48._0_12_;
        auVar7._13_2_ = auVar3._13_2_;
        auVar9[0xb] = 0;
        auVar9._0_11_ = auVar48._0_11_;
        auVar9._12_3_ = auVar7._12_3_;
        auVar13[10] = auVar48[5];
        auVar13._0_10_ = auVar48._0_10_;
        auVar13._11_4_ = auVar9._11_4_;
        auVar16[9] = 0;
        auVar16._0_9_ = auVar48._0_9_;
        auVar16._10_5_ = auVar13._10_5_;
        auVar18[8] = auVar48[4];
        auVar18._0_8_ = auVar48._0_8_;
        auVar18._9_6_ = auVar16._9_6_;
        auVar22._7_8_ = 0;
        auVar22._0_7_ = auVar18._8_7_;
        Var23 = CONCAT81(SUB158(auVar22 << 0x40,7),auVar48[3]);
        auVar32._9_6_ = 0;
        auVar32._0_9_ = Var23;
        auVar24._1_10_ = SUB1510(auVar32 << 0x30,5);
        auVar24[0] = auVar48[2];
        auVar33._11_4_ = 0;
        auVar33._0_11_ = auVar24;
        auVar25._1_12_ = SUB1512(auVar33 << 0x20,3);
        auVar25[0] = auVar48[1];
        uVar45 = CONCAT11(0,auVar48[0]);
        auVar20._2_13_ = auVar25;
        auVar20._0_2_ = uVar45;
        auVar4._10_2_ = 0;
        auVar4._0_10_ = auVar20._0_10_;
        auVar4._12_2_ = (short)Var23;
        auVar26._2_4_ = auVar4._10_4_;
        auVar26._0_2_ = auVar24._0_2_;
        auVar26._6_8_ = 0;
        auVar53._6_8_ = SUB148(auVar26 << 0x40,6);
        auVar53._4_2_ = auVar25._0_2_;
        auVar53._2_2_ = 0;
        auVar53._0_2_ = uVar45;
        auVar53._14_2_ = 0;
        maskmovdqu(auVar53,auVar42);
        auVar46._2_2_ = 0;
        auVar46._0_2_ = auVar18._8_2_;
        auVar46._4_2_ = auVar13._10_2_;
        auVar46._6_2_ = 0;
        auVar46._8_2_ = auVar7._12_2_;
        auVar46._10_2_ = 0;
        auVar46[0xc] = auVar48[7];
        auVar46._13_3_ = 0;
        maskmovdqu(auVar46,auVar42);
        auVar10[0xc] = auVar48[0xb];
        auVar10._0_12_ = ZEXT112(auVar48[0xc]) << 0x40;
        auVar11._10_3_ = auVar10._10_3_;
        auVar11._0_10_ = (unkuint10)auVar48[10] << 0x40;
        auVar27._5_8_ = 0;
        auVar27._0_5_ = auVar11._8_5_;
        auVar14[4] = auVar48[9];
        auVar14._0_4_ = uVar38;
        auVar14[5] = 0;
        auVar14._6_7_ = SUB137(auVar27 << 0x40,6);
        auVar47._0_4_ = uVar38 & 0xffff;
        auVar47._4_9_ = auVar14._4_9_;
        auVar47._13_3_ = 0;
        maskmovdqu(auVar47,auVar42);
        auVar51._1_3_ = 0;
        auVar51[0] = auVar48[0xc];
        auVar51[4] = auVar48[0xd];
        auVar51._5_3_ = 0;
        auVar51[8] = auVar48[0xe];
        auVar51._9_3_ = 0;
        auVar51[0xc] = auVar48[0xf];
        auVar51._13_3_ = 0;
        maskmovdqu(auVar51,auVar42);
        uVar40 = uVar39 + 0x10;
        iVar2 = (int)uVar39;
        uVar39 = uVar40;
      } while (iVar2 + 0x20 < width);
    }
    uVar38 = (uint)uVar40;
    if ((int)(uVar38 | 8) < width) {
      uVar40 = *(ulong *)(alpha + (uVar40 & 0xffffffff));
      auVar48._8_8_ = 0;
      auVar48._0_8_ = uVar40;
      auVar43 = auVar43 & auVar48;
      uVar50 = (undefined1)(uVar40 >> 0x38);
      auVar5._8_6_ = 0;
      auVar5._0_8_ = uVar40;
      auVar5[0xe] = uVar50;
      auVar8._8_4_ = 0;
      auVar8._0_8_ = uVar40;
      auVar8[0xc] = (char)(uVar40 >> 0x30);
      auVar8._13_2_ = auVar5._13_2_;
      auVar12._8_4_ = 0;
      auVar12._0_8_ = uVar40;
      auVar12._12_3_ = auVar8._12_3_;
      auVar15._8_2_ = 0;
      auVar15._0_8_ = uVar40;
      auVar15[10] = (char)(uVar40 >> 0x28);
      auVar15._11_4_ = auVar12._11_4_;
      auVar17._8_2_ = 0;
      auVar17._0_8_ = uVar40;
      auVar17._10_5_ = auVar15._10_5_;
      auVar19[8] = (char)(uVar40 >> 0x20);
      auVar19._0_8_ = uVar40;
      auVar19._9_6_ = auVar17._9_6_;
      auVar28._7_8_ = 0;
      auVar28._0_7_ = auVar19._8_7_;
      Var23 = CONCAT81(SUB158(auVar28 << 0x40,7),(char)(uVar40 >> 0x18));
      auVar34._9_6_ = 0;
      auVar34._0_9_ = Var23;
      auVar29._1_10_ = SUB1510(auVar34 << 0x30,5);
      auVar29[0] = (char)(uVar40 >> 0x10);
      auVar35._11_4_ = 0;
      auVar35._0_11_ = auVar29;
      auVar30._1_12_ = SUB1512(auVar35 << 0x20,3);
      auVar30[0] = (char)(uVar40 >> 8);
      uVar45 = CONCAT11(0,(byte)uVar40);
      auVar21._2_13_ = auVar30;
      auVar21._0_2_ = uVar45;
      auVar6._10_2_ = 0;
      auVar6._0_10_ = auVar21._0_10_;
      auVar6._12_2_ = (short)Var23;
      auVar31._2_4_ = auVar6._10_4_;
      auVar31._0_2_ = auVar29._0_2_;
      auVar31._6_8_ = 0;
      auVar52._6_8_ = SUB148(auVar31 << 0x40,6);
      auVar52._4_2_ = auVar30._0_2_;
      auVar52._2_2_ = 0;
      auVar52._0_2_ = uVar45;
      auVar52._14_2_ = 0;
      maskmovdqu(auVar52,auVar42);
      auVar49._2_2_ = 0;
      auVar49._0_2_ = auVar19._8_2_;
      auVar49._4_2_ = auVar15._10_2_;
      auVar49._6_2_ = 0;
      auVar49._8_2_ = auVar8._12_2_;
      auVar49._10_2_ = 0;
      auVar49[0xc] = uVar50;
      auVar49._13_3_ = 0;
      maskmovdqu(auVar49,auVar42);
      uVar38 = uVar38 | 8;
    }
    if ((int)uVar38 < width) {
      uVar40 = (ulong)uVar38;
      do {
        bVar1 = alpha[uVar40];
        dst[uVar40 * 4] = bVar1;
        bVar36 = bVar36 & bVar1;
        uVar40 = uVar40 + 1;
      } while ((uint)width != uVar40);
    }
    alpha = alpha + alpha_stride;
    dst = dst + dst_stride;
    iVar37 = iVar37 + 1;
  } while (iVar37 != height);
  auVar44[0] = -(auVar43[0] == -1);
  auVar44[1] = -(auVar43[1] == -1);
  auVar44[2] = -(auVar43[2] == -1);
  auVar44[3] = -(auVar43[3] == -1);
  auVar44[4] = -(auVar43[4] == -1);
  auVar44[5] = -(auVar43[5] == -1);
  auVar44[6] = -(auVar43[6] == -1);
  auVar44[7] = -(auVar43[7] == -1);
  auVar44[8] = -(auVar43[8] == -1);
  auVar44[9] = -(auVar43[9] == -1);
  auVar44[10] = -(auVar43[10] == -1);
  auVar44[0xb] = -(auVar43[0xb] == -1);
  auVar44[0xc] = -(auVar43[0xc] == -1);
  auVar44[0xd] = -(auVar43[0xd] == -1);
  auVar44[0xe] = -(auVar43[0xe] == -1);
  auVar44[0xf] = -(auVar43[0xf] == -1);
  auVar42[0] = -(auVar41[0] == -1);
  auVar42[1] = -(auVar41[1] == -1);
  auVar42[2] = -(auVar41[2] == -1);
  auVar42[3] = -(auVar41[3] == -1);
  auVar42[4] = -(auVar41[4] == -1);
  auVar42[5] = -(auVar41[5] == -1);
  auVar42[6] = -(auVar41[6] == -1);
  auVar42[7] = -(auVar41[7] == -1);
  auVar42[8] = -(auVar41[8] == -1);
  auVar42[9] = -(auVar41[9] == -1);
  auVar42[10] = -(auVar41[10] == -1);
  auVar42[0xb] = -(auVar41[0xb] == -1);
  auVar42[0xc] = -(auVar41[0xc] == -1);
  auVar42[0xd] = -(auVar41[0xd] == -1);
  auVar42[0xe] = -(auVar41[0xe] == -1);
  auVar42[0xf] = -(auVar41[0xf] == -1);
  return (int)((ushort)((ushort)(SUB161(auVar42 >> 7,0) & 1) |
                        (ushort)(SUB161(auVar42 >> 0xf,0) & 1) << 1 |
                        (ushort)(SUB161(auVar42 >> 0x17,0) & 1) << 2 |
                        (ushort)(SUB161(auVar42 >> 0x1f,0) & 1) << 3 |
                        (ushort)(SUB161(auVar42 >> 0x27,0) & 1) << 4 |
                        (ushort)(SUB161(auVar42 >> 0x2f,0) & 1) << 5 |
                        (ushort)(SUB161(auVar42 >> 0x37,0) & 1) << 6 |
                        (ushort)(SUB161(auVar42 >> 0x3f,0) & 1) << 7 |
                        (ushort)(SUB161(auVar42 >> 0x47,0) & 1) << 8 |
                        (ushort)(SUB161(auVar42 >> 0x4f,0) & 1) << 9 |
                        (ushort)(SUB161(auVar42 >> 0x57,0) & 1) << 10 |
                        (ushort)(SUB161(auVar42 >> 0x5f,0) & 1) << 0xb |
                        (ushort)(SUB161(auVar42 >> 0x67,0) & 1) << 0xc |
                        (ushort)(SUB161(auVar42 >> 0x6f,0) & 1) << 0xd |
                        (ushort)(SUB161(auVar42 >> 0x77,0) & 1) << 0xe |
                       (ushort)(auVar42[0xf] >> 7) << 0xf) != 0xffff ||
              ((SUB161(auVar44 >> 7,0) & 1 | (SUB161(auVar44 >> 0xf,0) & 1) << 1 |
                (SUB161(auVar44 >> 0x17,0) & 1) << 2 | (SUB161(auVar44 >> 0x1f,0) & 1) << 3 |
                (SUB161(auVar44 >> 0x27,0) & 1) << 4 | (SUB161(auVar44 >> 0x2f,0) & 1) << 5 |
                (SUB161(auVar44 >> 0x37,0) & 1) << 6 | SUB161(auVar44 >> 0x3f,0) << 7) & bVar36) !=
              0xff);
}

Assistant:

static int DispatchAlpha_SSE2(const uint8_t* WEBP_RESTRICT alpha,
                              int alpha_stride, int width, int height,
                              uint8_t* WEBP_RESTRICT dst, int dst_stride) {
  // alpha_and stores an 'and' operation of all the alpha[] values. The final
  // value is not 0xff if any of the alpha[] is not equal to 0xff.
  uint32_t alpha_and = 0xff;
  int i, j;
  const __m128i zero = _mm_setzero_si128();
  const __m128i alpha_mask = _mm_set1_epi32((int)0xff);  // to preserve A
  const __m128i all_0xff = _mm_set1_epi8((char)0xff);
  __m128i all_alphas16 = all_0xff;
  __m128i all_alphas8 = all_0xff;

  // We must be able to access 3 extra bytes after the last written byte
  // 'dst[4 * width - 4]', because we don't know if alpha is the first or the
  // last byte of the quadruplet.
  for (j = 0; j < height; ++j) {
    char* ptr = (char*)dst;
    for (i = 0; i + 16 <= width - 1; i += 16) {
      // load 16 alpha bytes
      const __m128i a0 = _mm_loadu_si128((const __m128i*)&alpha[i]);
      const __m128i a1_lo = _mm_unpacklo_epi8(a0, zero);
      const __m128i a1_hi = _mm_unpackhi_epi8(a0, zero);
      const __m128i a2_lo_lo = _mm_unpacklo_epi16(a1_lo, zero);
      const __m128i a2_lo_hi = _mm_unpackhi_epi16(a1_lo, zero);
      const __m128i a2_hi_lo = _mm_unpacklo_epi16(a1_hi, zero);
      const __m128i a2_hi_hi = _mm_unpackhi_epi16(a1_hi, zero);
      _mm_maskmoveu_si128(a2_lo_lo, alpha_mask, ptr + 0);
      _mm_maskmoveu_si128(a2_lo_hi, alpha_mask, ptr + 16);
      _mm_maskmoveu_si128(a2_hi_lo, alpha_mask, ptr + 32);
      _mm_maskmoveu_si128(a2_hi_hi, alpha_mask, ptr + 48);
      // accumulate 16 alpha 'and' in parallel
      all_alphas16 = _mm_and_si128(all_alphas16, a0);
      ptr += 64;
    }
    if (i + 8 <= width - 1) {
      // load 8 alpha bytes
      const __m128i a0 = _mm_loadl_epi64((const __m128i*)&alpha[i]);
      const __m128i a1 = _mm_unpacklo_epi8(a0, zero);
      const __m128i a2_lo = _mm_unpacklo_epi16(a1, zero);
      const __m128i a2_hi = _mm_unpackhi_epi16(a1, zero);
      _mm_maskmoveu_si128(a2_lo, alpha_mask, ptr);
      _mm_maskmoveu_si128(a2_hi, alpha_mask, ptr + 16);
      // accumulate 8 alpha 'and' in parallel
      all_alphas8 = _mm_and_si128(all_alphas8, a0);
      i += 8;
    }
    for (; i < width; ++i) {
      const uint32_t alpha_value = alpha[i];
      dst[4 * i] = alpha_value;
      alpha_and &= alpha_value;
    }
    alpha += alpha_stride;
    dst += dst_stride;
  }
  // Combine the eight alpha 'and' into a 8-bit mask.
  alpha_and &= _mm_movemask_epi8(_mm_cmpeq_epi8(all_alphas8, all_0xff)) & 0xff;
  return (alpha_and != 0xff ||
          _mm_movemask_epi8(_mm_cmpeq_epi8(all_alphas16, all_0xff)) != 0xffff);
}